

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  bool bVar1;
  pointer this_00;
  ExpectationBase *pEVar2;
  ExpectationBase *in_RDX;
  linked_ptr_internal *extraout_RDX;
  linked_ptr_internal *extraout_RDX_00;
  linked_ptr_internal lVar3;
  undefined8 in_RSI;
  ExpectationBase *in_RDI;
  Expectation EVar4;
  const_iterator it;
  linked_ptr<testing::internal::ExpectationBase> *in_stack_ffffffffffffff78;
  string *msg;
  int line;
  ExpectationBase *file;
  undefined1 condition;
  undefined1 local_51 [33];
  linked_ptr<testing::internal::ExpectationBase> *local_30;
  linked_ptr<testing::internal::ExpectationBase> *local_28;
  __normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
  local_20;
  ExpectationBase *local_18;
  
  file = in_RDI;
  local_18 = in_RDX;
  local_28 = (linked_ptr<testing::internal::ExpectationBase> *)
             std::
             vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
             ::begin((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                      *)in_stack_ffffffffffffff78);
  __gnu_cxx::
  __normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>const*,std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>>>>
  ::__normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>*>
            ((__normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
              *)in_RDI,
             (__normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
              *)in_stack_ffffffffffffff78);
  do {
    local_30 = (linked_ptr<testing::internal::ExpectationBase> *)
               std::
               vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
               ::end((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                      *)in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
                        *)in_stack_ffffffffffffff78);
    condition = (undefined1)((ulong)in_RSI >> 0x38);
    if (!bVar1) {
      msg = (string *)local_51;
      std::allocator<char>::allocator();
      line = (int)((ulong)in_RDI >> 0x20);
      std::__cxx11::string::string
                ((string *)(local_51 + 1),"Cannot find expectation.",(allocator *)msg);
      Assert((bool)condition,(char *)file,line,msg);
      std::__cxx11::string::~string((string *)(local_51 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_51);
      Expectation::Expectation((Expectation *)0x2363f5);
      lVar3.next_ = extraout_RDX_00;
LAB_0023642b:
      EVar4.expectation_base_.link_.next_ = lVar3.next_;
      EVar4.expectation_base_.value_ = file;
      return (Expectation)EVar4.expectation_base_;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
              ::operator->(&local_20);
    pEVar2 = linked_ptr<testing::internal::ExpectationBase>::get(this_00);
    if (pEVar2 == local_18) {
      __gnu_cxx::
      __normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
      ::operator*(&local_20);
      Expectation::Expectation((Expectation *)in_RDI,in_stack_ffffffffffffff78);
      lVar3.next_ = extraout_RDX;
      goto LAB_0023642b;
    }
    __gnu_cxx::
    __normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
    ::operator++(&local_20);
  } while( true );
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}